

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmLibrary.cpp
# Opt level: O0

JavascriptMethod Js::WasmLibrary::EnsureWasmEntrypoint(ScriptFunction *func)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  FunctionBody *pFVar4;
  AsmJsFunctionInfo *this;
  ScriptContext *scriptContext_00;
  ProxyEntryPointInfo *pPVar5;
  JavascriptError *pJVar6;
  WasmReaderInfo *readerinfo;
  undefined4 *puVar7;
  ScriptFunction *local_c0;
  JavascriptMethod jsMethod;
  FunctionEntryPointInfo *defaultEntryPoint;
  JavascriptError *pError;
  JavascriptLibrary *library;
  char16 *exceptionMessage;
  AutoFreeExceptionMessage autoCleanExceptionMessage;
  WasmCompilationException *ex;
  WasmReaderInfo *readerInfo;
  FunctionEntryPointInfo *entrypointInfo;
  ScriptContext *scriptContext;
  AsmJsFunctionInfo *info;
  FunctionBody *body;
  ScriptFunction *func_local;
  
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  bVar2 = ParseableFunctionInfo::IsWasmFunction(&pFVar4->super_ParseableFunctionInfo);
  if (bVar2) {
    pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
    this = FunctionBody::GetAsmJsFunctionInfo(pFVar4);
    scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)func);
    pPVar5 = ScriptFunction::GetEntryPointInfo(func);
    pJVar6 = AsmJsFunctionInfo::GetLazyError(this);
    if (pJVar6 == (JavascriptError *)0x0) {
      uVar3 = FunctionBody::GetByteCodeCount(pFVar4);
      if (uVar3 == 0) {
        readerinfo = AsmJsFunctionInfo::GetWasmReaderInfo(this);
        if (readerinfo == (WasmReaderInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                      ,0x37,"(readerInfo)","readerInfo");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        Wasm::WasmBytecodeGenerator::GenerateFunctionBytecode(scriptContext_00,readerinfo,false);
        pPVar5->jsMethod = InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
        WAsmJs::JitFunctionIfReady(func,0);
      }
      else {
        bVar2 = FunctionBody::GetIsAsmJsFullJitScheduled(pFVar4);
        if (bVar2) {
          pPVar5 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)pFVar4);
          ScriptFunction::ChangeEntryPoint(func,pPVar5,(JavascriptMethod)pPVar5->jsMethod);
        }
        else {
          pPVar5->jsMethod = InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
        }
      }
    }
    else {
      pPVar5->jsMethod = WasmLazyTrapCallback;
    }
    bVar2 = FunctionProxy::HasValidEntryPoint((FunctionProxy *)pFVar4);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                  ,0x56,"(body->HasValidEntryPoint())","body->HasValidEntryPoint()")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pPVar5 = ScriptFunction::GetEntryPointInfo(func);
    local_c0 = (ScriptFunction *)pPVar5->jsMethod;
    if (local_c0 == (ScriptFunction *)InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk) {
      local_c0 = (ScriptFunction *)0x0;
    }
    func_local = local_c0;
  }
  else {
    func_local = (ScriptFunction *)0x0;
  }
  return (JavascriptMethod)func_local;
}

Assistant:

Js::JavascriptMethod Js::WasmLibrary::EnsureWasmEntrypoint(Js::ScriptFunction* func)
{
#ifdef ENABLE_WASM
    if (func->GetFunctionBody()->IsWasmFunction())
    {
        FunctionBody* body = func->GetFunctionBody();
        AsmJsFunctionInfo* info = body->GetAsmJsFunctionInfo();
        ScriptContext* scriptContext = func->GetScriptContext();

        Js::FunctionEntryPointInfo * entrypointInfo = (Js::FunctionEntryPointInfo*)func->GetEntryPointInfo();
        if (info->GetLazyError())
        {
            // We might have parsed this in the past and there was an error
            entrypointInfo->jsMethod = WasmLibrary::WasmLazyTrapCallback;
        }
        else if (body->GetByteCodeCount() == 0)
        {
            Wasm::WasmReaderInfo* readerInfo = info->GetWasmReaderInfo();
            AssertOrFailFast(readerInfo);
            try
            {
                Wasm::WasmBytecodeGenerator::GenerateFunctionBytecode(scriptContext, readerInfo);
                entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
                WAsmJs::JitFunctionIfReady(func);
            }
            catch (Wasm::WasmCompilationException& ex)
            {
                AutoFreeExceptionMessage autoCleanExceptionMessage;
                char16* exceptionMessage = WebAssemblyModule::FormatExceptionMessage(&ex, &autoCleanExceptionMessage, readerInfo->m_module, body);

                JavascriptLibrary *library = scriptContext->GetLibrary();
                JavascriptError *pError = library->CreateWebAssemblyCompileError();
                JavascriptError::SetErrorMessage(pError, WASMERR_WasmCompileError, exceptionMessage, scriptContext);

                entrypointInfo->jsMethod = WasmLibrary::WasmLazyTrapCallback;
                info->SetLazyError(pError);
            }
        }
        // The function has already been parsed, just fix up the entry point
        else if (body->GetIsAsmJsFullJitScheduled())
        {
            Js::FunctionEntryPointInfo* defaultEntryPoint = (Js::FunctionEntryPointInfo*)body->GetDefaultEntryPointInfo();
            func->ChangeEntryPoint(defaultEntryPoint, defaultEntryPoint->jsMethod);
        }
        else
        {
            entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
        }

        Assert(body->HasValidEntryPoint());
        Js::JavascriptMethod jsMethod = func->GetEntryPointInfo()->jsMethod;
        // We are already in AsmJsDefaultEntryThunk so return null so it just keeps going
        return jsMethod == AsmJsDefaultEntryThunk ? nullptr : jsMethod;
    }
#endif
    return nullptr;
}